

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O1

CharItem ** __thiscall
Hpipe::Vec<Hpipe::CharItem_const*>::push_back<Hpipe::CharItem_const*&>
          (Vec<Hpipe::CharItem_const*> *this,CharItem **args)

{
  iterator __position;
  
  __position._M_current = *(CharItem ***)(this + 8);
  if (__position._M_current == *(CharItem ***)(this + 0x10)) {
    std::vector<Hpipe::CharItem_const*,std::allocator<Hpipe::CharItem_const*>>::
    _M_realloc_insert<Hpipe::CharItem_const*&>
              ((vector<Hpipe::CharItem_const*,std::allocator<Hpipe::CharItem_const*>> *)this,
               __position,args);
  }
  else {
    *__position._M_current = *args;
    *(long *)(this + 8) = *(long *)(this + 8) + 8;
  }
  return (CharItem **)(*(long *)(this + 8) + -8);
}

Assistant:

T       *push_back            ( Args &&...args ) { this->emplace_back( std::forward<Args>( args )... ); return &this->back(); }